

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O0

int is_valid_date(int64_t year,int64_t month,int64_t day)

{
  bool local_34;
  bool local_33;
  bool local_32;
  bool local_31;
  int64_t day_local;
  int64_t month_local;
  int64_t year_local;
  
  if ((((day < 1) || (month < 1)) || (year < 0)) || (9999 < year)) {
    return 0;
  }
  if (month != 1) {
    if (month == 2) {
      if (((year % 4 != 0) || (year % 100 == 0)) && (year % 400 != 0)) {
        local_34 = 0 < day && day < 0x1d;
        return (uint)local_34;
      }
      local_33 = 0 < day && day < 0x1e;
      return (uint)local_33;
    }
    if (month != 3) {
      if (month == 4) {
LAB_002f232e:
        local_32 = 0 < day && day < 0x1f;
        return (uint)local_32;
      }
      if (month != 5) {
        if (month == 6) goto LAB_002f232e;
        if (1 < month - 7U) {
          if (month == 9) goto LAB_002f232e;
          if (month != 10) {
            if (month == 0xb) goto LAB_002f232e;
            if (month != 0xc) {
              return 0;
            }
          }
        }
      }
    }
  }
  local_31 = 0 < day && day < 0x20;
  return (uint)local_31;
}

Assistant:

static int is_valid_date(int64_t year, int64_t month, int64_t day) {
  if (day < 1 || month < 1 || year < 0 || year > 9999) {
    return 0;
  }
  switch (month) {
    case 1:
    case 3:
    case 5:
    case 7:
    case 8:
    case 10:
    case 12:
      return day > 0 && day <= 31;
    case 4:
    case 6:
    case 9:
    case 11:
      return day > 0 && day <= 30;
    case 2:
      if ((year % 4 == 0 && year % 100 != 0) || year % 400 == 0) {
        return day > 0 && day <= 29;
      } else {
        return day > 0 && day <= 28;
      }
    default:
      return 0;
  }
}